

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O0

tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
* tchecker::tck_reach::concur19::run
            (tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,
            string *search_order,covering_t covering,size_t block_size,size_t table_size)

{
  bool bVar1;
  policy_t policy_00;
  system_t *this;
  element_type *peVar2;
  system_t *system_00;
  ostream *poVar3;
  refzg_t *__p;
  graph_t *this_00;
  system_t *this_01;
  element_type *peVar4;
  element_type *peVar5;
  invalid_argument *this_02;
  stats_t local_150;
  stats_t local_118;
  algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> local_d9;
  undefined1 local_d8 [7];
  algorithm_t algorithm;
  stats_t stats;
  undefined1 local_98 [4];
  policy_t policy;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  shared_ptr<tchecker::tck_reach::concur19::graph_t> graph;
  shared_ptr<tchecker::refzg::refzg_t> refzg;
  undefined1 local_48 [8];
  shared_ptr<const_tchecker::ta::system_t> system;
  size_t block_size_local;
  covering_t covering_local;
  string *search_order_local;
  string *labels_local;
  system_declaration_t *sysdecl_local;
  
  system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)block_size;
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  std::shared_ptr<tchecker::ta::system_t_const>::shared_ptr<tchecker::ta::system_t,void>
            ((shared_ptr<tchecker::ta::system_t_const> *)local_48,this);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  system_00 = syncprod::system_t::as_system_system(&peVar2->super_system_t);
  bVar1 = tchecker::system::every_process_has_initial_location(system_00);
  if (!bVar1) {
    poVar3 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    poVar3 = std::operator<<(poVar3,"system has no initial state");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  __p = tchecker::refzg::factory
                  ((shared_ptr<const_tchecker::ta::system_t> *)local_48,SHARING,
                   PROCESS_REFERENCE_CLOCKS,SYNC_ELAPSED_SEMANTICS,0x7fffffff,
                   (size_t)system.
                           super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,table_size);
  std::shared_ptr<tchecker::refzg::refzg_t>::shared_ptr<tchecker::refzg::refzg_t,void>
            ((shared_ptr<tchecker::refzg::refzg_t> *)
             &graph.
              super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  this_00 = (graph_t *)operator_new(0x140);
  graph_t::graph_t(this_00,(shared_ptr<tchecker::refzg::refzg_t> *)
                           &graph.
                            super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                   (size_t)system.
                           super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,table_size);
  std::shared_ptr<tchecker::tck_reach::concur19::graph_t>::
  shared_ptr<tchecker::tck_reach::concur19::graph_t,void>
            ((shared_ptr<tchecker::tck_reach::concur19::graph_t> *)&accepting_labels.m_num_bits,
             this_00);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  this_01 = ta::system_t::as_syncprod_system(peVar2);
  syncprod::system_t::labels
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,this_01,
             labels);
  policy_00 = algorithms::fast_remove_waiting_policy(search_order);
  algorithms::covreach::stats_t::stats_t((stats_t *)local_d8);
  if (covering == COVERING_FULL) {
    peVar4 = std::
             __shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&graph.
                             super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
    peVar5 = std::
             __shared_ptr_access<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&accepting_labels.m_num_bits);
    algorithms::covreach::
    algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::
    run<(tchecker::algorithms::covreach::covering_t)0>
              (&local_118,&local_d9,peVar4,peVar5,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,policy_00);
    memcpy(local_d8,&local_118,0x31);
  }
  else {
    if (covering != COVERING_LEAF_NODES) {
      this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_02,"Unknown covering policy for covreach algorithm");
      __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    peVar4 = std::
             __shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&graph.
                             super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
    peVar5 = std::
             __shared_ptr_access<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&accepting_labels.m_num_bits);
    algorithms::covreach::
    algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::
    run<(tchecker::algorithms::covreach::covering_t)1>
              (&local_150,&local_d9,peVar4,peVar5,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,policy_00);
    memcpy(local_d8,&local_150,0x31);
  }
  std::
  make_tuple<tchecker::algorithms::covreach::stats_t&,std::shared_ptr<tchecker::tck_reach::concur19::graph_t>&>
            (__return_storage_ptr__,(stats_t *)local_d8,
             (shared_ptr<tchecker::tck_reach::concur19::graph_t> *)&accepting_labels.m_num_bits);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_98);
  std::shared_ptr<tchecker::tck_reach::concur19::graph_t>::~shared_ptr
            ((shared_ptr<tchecker::tck_reach::concur19::graph_t> *)&accepting_labels.m_num_bits);
  std::shared_ptr<tchecker::refzg::refzg_t>::~shared_ptr
            ((shared_ptr<tchecker::refzg::refzg_t> *)
             &graph.
              super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<const_tchecker::ta::system_t>::~shared_ptr
            ((shared_ptr<const_tchecker::ta::system_t> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<tchecker::algorithms::covreach::stats_t, std::shared_ptr<tchecker::tck_reach::concur19::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::string const & search_order,
    tchecker::algorithms::covreach::covering_t covering, std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::refzg::refzg_t> refzg{tchecker::refzg::factory(
      system, tchecker::ts::SHARING, tchecker::refzg::PROCESS_REFERENCE_CLOCKS, tchecker::refzg::SYNC_ELAPSED_SEMANTICS,
      tchecker::refdbm::UNBOUNDED_SPREAD, block_size, table_size)};

  std ::shared_ptr<tchecker::tck_reach::concur19::graph_t> graph{
      new tchecker::tck_reach::concur19::graph_t{refzg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  enum tchecker::waiting::policy_t policy = tchecker::algorithms::fast_remove_waiting_policy(search_order);

  tchecker::algorithms::covreach::stats_t stats;
  tchecker::tck_reach::concur19::algorithm_t algorithm;

  if (covering == tchecker::algorithms::covreach::COVERING_FULL)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_FULL>(*refzg, *graph, accepting_labels, policy);
  else if (covering == tchecker::algorithms::covreach::COVERING_LEAF_NODES)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_LEAF_NODES>(*refzg, *graph, accepting_labels, policy);
  else
    throw std::invalid_argument("Unknown covering policy for covreach algorithm");

  return std::make_tuple(stats, graph);
}